

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstanceSymbols.cpp
# Opt level: O0

void anon_unknown.dwarf_566c5b::
     resolveInstanceOverrides<slang::syntax::HierarchyInstantiationSyntax>
               (ResolvedConfig *resolvedConfig,ASTContext *context,
               HierarchyInstantiationSyntax *syntax,string_view defName,DiagCode missingCode,
               ResolvedInstanceRules *results)

{
  string_view name;
  SourceRange sourceRange;
  string_view lookupName;
  flat_hash_map<std::string_view,_InstanceOverride> *pfVar1;
  size_t *psVar2;
  string_view *psVar3;
  bool bVar4;
  bool bVar5;
  InstanceBodySymbol *pIVar6;
  reference ppSVar7;
  DefinitionSymbol *pDVar8;
  pointer ppVar9;
  size_type sVar10;
  DefinitionLookupResult *pDVar11;
  undefined8 in_RCX;
  long in_RDX;
  long in_RDI;
  undefined8 in_R8;
  undefined4 in_R9D;
  SourceRange SVar12;
  SourceRange SVar13;
  Token *in_stack_00000008;
  type *child;
  type *_;
  const_iterator __end0_1;
  const_iterator __begin0_1;
  flat_hash_map<std::string_view,_InstanceOverride> *__range4;
  DefinitionLookupResult defResult;
  const_iterator ruleIt;
  basic_string_view<char,_std::char_traits<char>_> instName;
  ConfigBlockSymbol *nestedConfig;
  HierarchicalInstanceSyntax *instSyntax;
  const_iterator __end0;
  const_iterator __begin0;
  SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *__range2;
  flat_hash_map<std::string_view,_InstanceOverride> *overrideMap;
  Compilation *comp;
  optional<slang::ast::Compilation::DefinitionLookupResult> explicitDef;
  const_iterator childIt;
  size_t i;
  InstanceOverride *overrideNode;
  const_iterator rootIt;
  string_view rootName;
  Symbol *rootSym;
  Symbol *sym;
  SmallVector<const_slang::ast::Symbol_*,_5UL> parentStack;
  Scope *scope;
  flat_hash_map<std::string_view,_InstanceOverride> *instOverrides;
  size_t hash;
  size_t hash_1;
  size_t hash_2;
  uint n_2;
  value_type *p_2;
  value_type *elements_2;
  int mask_2;
  group_type *pg_2;
  size_t pos_2;
  prober pb_2;
  uint n_1;
  value_type *p_1;
  value_type *elements_1;
  int mask_1;
  group_type *pg_1;
  size_t pos_1;
  prober pb_1;
  uint n;
  value_type *p;
  value_type *elements;
  int mask;
  group_type *pg;
  size_t pos;
  prober pb;
  SourceLocation in_stack_fffffffffffff7b8;
  SourceLocation in_stack_fffffffffffff7c0;
  SourceLocation this;
  undefined4 in_stack_fffffffffffff7c8;
  undefined4 in_stack_fffffffffffff7cc;
  Token *in_stack_fffffffffffff7d0;
  undefined5 in_stack_fffffffffffff7d8;
  undefined1 in_stack_fffffffffffff7dd;
  undefined1 in_stack_fffffffffffff7de;
  undefined1 in_stack_fffffffffffff7df;
  Token *in_stack_fffffffffffff7e0;
  ConfigRule *in_stack_fffffffffffff810;
  SourceLocation in_stack_fffffffffffff818;
  SourceLocation in_stack_fffffffffffff820;
  Compilation *in_stack_fffffffffffff828;
  Scope *in_stack_fffffffffffff830;
  SourceLocation SVar14;
  SourceLocation SVar15;
  SourceLocation configBlock;
  SourceLocation node;
  ASTContext *context_00;
  ConfigRule *in_stack_fffffffffffff970;
  Scope *in_stack_fffffffffffff978;
  Compilation *in_stack_fffffffffffff980;
  Compilation *in_stack_fffffffffffff988;
  Compilation *pCVar16;
  char *in_stack_fffffffffffff990;
  string_view *local_5e0;
  SourceRange in_stack_fffffffffffffaa0;
  DiagCode in_stack_fffffffffffffab0;
  pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
  local_510;
  undefined4 local_4ec;
  SourceRange local_4e8;
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  DefinitionLookupResult local_4c0;
  const_iterator local_4a8;
  SourceLocation local_498;
  SourceLocation local_490;
  string_view local_488;
  ConfigBlockSymbol *local_478;
  HierarchicalInstanceSyntax *local_470;
  const_iterator local_468;
  const_iterator local_458;
  long local_448;
  Compilation *local_440;
  Compilation *local_438;
  const_iterator local_410;
  char_pointer local_400;
  table_element_pointer local_3f8;
  size_type local_3f0;
  Compilation *local_3e8;
  undefined4 local_3dc;
  const_iterator local_3d8;
  char_pointer local_3c8;
  table_element_pointer local_3c0;
  size_t local_3b8;
  char *pcStack_3b0;
  DefinitionSymbol *local_3a0;
  InstanceSymbol *local_388;
  SmallVectorBase<const_slang::ast::Symbol_*> local_380 [2];
  Scope *local_340;
  flat_hash_map<std::string_view,_InstanceOverride> *local_338;
  long local_330;
  long local_320;
  undefined4 local_314;
  undefined8 local_310;
  undefined8 uStack_308;
  string_view *local_300;
  Compilation *local_2f8;
  SourceLocation local_2f0;
  SourceLocation local_2e8;
  string_view *local_2e0;
  Compilation *local_2d8;
  char_pointer local_2d0;
  table_element_pointer local_2c8;
  size_t *local_2c0;
  flat_hash_map<std::string_view,_InstanceOverride> *local_2b8;
  char_pointer local_2b0;
  table_element_pointer local_2a8;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_2a0;
  size_t *local_290;
  flat_hash_map<std::string_view,_InstanceOverride> *local_288;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_280;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_270;
  string_view *local_260;
  Compilation *local_258;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_250;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
  local_240;
  string_view *local_230;
  Compilation *local_228;
  table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
  local_220;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
  local_210;
  string_view *local_1f8;
  Compilation *local_1f0;
  iterator local_1e8;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
  local_1d8;
  string_view *local_1c0;
  Compilation *local_1b8;
  iterator local_1b0;
  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
  local_1a0;
  size_t *local_188;
  flat_hash_map<std::string_view,_InstanceOverride> *local_180;
  iterator local_178;
  size_t local_168;
  size_t *local_160;
  flat_hash_map<std::string_view,_InstanceOverride> *local_158;
  char *local_150;
  ConfigRule *local_148;
  Compilation *local_140;
  size_t local_138;
  string_view *local_130;
  Compilation *local_128;
  uint local_11c;
  value_type *local_118;
  value_type *local_110;
  uint local_104;
  group_type *local_100;
  size_t local_f8;
  pow2_quadratic_prober local_f0;
  size_t local_e0;
  size_t local_d8;
  string_view *local_d0;
  Compilation *local_c8;
  uint local_bc;
  value_type *local_b8;
  value_type *local_b0;
  uint local_a4;
  group_type *local_a0;
  size_t local_98;
  pow2_quadratic_prober local_90;
  char *local_80;
  Scope *local_78;
  ConfigRule *local_70;
  Compilation *local_68;
  uint local_5c;
  value_type *local_58;
  value_type *local_50;
  uint local_44;
  group_type *local_40;
  size_t local_38;
  pow2_quadratic_prober local_30;
  size_t local_20;
  size_t local_18;
  size_t *local_10;
  flat_hash_map<std::string_view,_InstanceOverride> *local_8;
  
  local_330 = in_RDX;
  local_320 = in_RDI;
  local_314 = in_R9D;
  local_310 = in_RCX;
  uStack_308 = in_R8;
  local_338 = slang::ast::ConfigBlockSymbol::getInstanceOverrides
                        ((ConfigBlockSymbol *)in_stack_fffffffffffff7c0);
  bVar4 = boost::unordered::
          unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
          ::empty((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   *)0x3a04d4);
  if (!bVar4) {
    local_340 = slang::not_null::operator_cast_to_Scope_
                          ((not_null<const_slang::ast::Scope_*> *)0x3a04ec);
    slang::SmallVector<const_slang::ast::Symbol_*,_5UL>::SmallVector
              ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x3a0501);
    do {
      local_388 = (InstanceSymbol *)slang::ast::Scope::asSymbol(local_340);
      if ((local_388->super_InstanceSymbolBase).super_Symbol.kind == InstanceBody) {
        pIVar6 = slang::ast::Symbol::as<slang::ast::InstanceBodySymbol>((Symbol *)0x3a0532);
        local_388 = pIVar6->parentInstance;
      }
      slang::SmallVectorBase<const_slang::ast::Symbol_*>::push_back
                ((SmallVectorBase<const_slang::ast::Symbol_*> *)in_stack_fffffffffffff7c0,
                 (Symbol **)in_stack_fffffffffffff7b8);
      local_340 = slang::ast::Symbol::getParentScope((Symbol *)local_388);
    } while ((local_340 != (Scope *)0x0) && (*(InstanceSymbol **)(local_320 + 8) != local_388));
    ppSVar7 = slang::SmallVectorBase<const_slang::ast::Symbol_*>::back(local_380);
    local_3a0 = (DefinitionSymbol *)*ppSVar7;
    pDVar8 = local_3a0;
    if ((local_3a0->super_Symbol).kind == Instance) {
      slang::ast::Symbol::as<slang::ast::InstanceSymbol>((Symbol *)0x3a0602);
      pDVar8 = slang::ast::InstanceSymbol::getDefinition((InstanceSymbol *)0x3a0619);
    }
    pfVar1 = local_338;
    local_5e0 = &(pDVar8->super_Symbol).name;
    local_3b8 = local_5e0->_M_len;
    pcStack_3b0 = (pDVar8->super_Symbol).name._M_str;
    local_2b8 = local_338;
    local_2c0 = &local_3b8;
    local_288 = local_338;
    local_180 = local_338;
    local_158 = local_338;
    local_290 = local_2c0;
    local_188 = local_2c0;
    local_160 = local_2c0;
    local_168 = boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                          ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                            *)in_stack_fffffffffffff7c0,
                           (basic_string_view<char,_std::char_traits<char>_> *)
                           in_stack_fffffffffffff7b8);
    psVar2 = local_160;
    local_18 = boost::unordered::detail::foa::
               table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
               ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                               *)in_stack_fffffffffffff7c0,(size_t)in_stack_fffffffffffff7b8);
    local_8 = pfVar1;
    local_10 = psVar2;
    local_20 = local_168;
    boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober(&local_30,local_18);
    do {
      local_38 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_30);
      local_40 = boost::unordered::detail::foa::
                 table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                 ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                           *)0x3a07cd);
      local_40 = local_40 + local_38;
      local_44 = boost::unordered::detail::foa::
                 group15<boost::unordered::detail::foa::plain_integral>::match
                           ((group15<boost::unordered::detail::foa::plain_integral> *)
                            CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                            (size_t)in_stack_fffffffffffff7c0);
      if (local_44 != 0) {
        local_50 = boost::unordered::detail::foa::
                   table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                               *)0x3a082b);
        local_58 = local_50 + local_38 * 0xf;
        do {
          local_5c = boost::unordered::detail::foa::unchecked_countr_zero(0);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
          ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                  *)0x3a087e);
          boost::unordered::detail::foa::
          table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
          ::
          key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>
                    ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                      *)0x3a08b2);
          bVar4 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::operator()
                            ((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *)
                             in_stack_fffffffffffff7e0,
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             CONCAT17(in_stack_fffffffffffff7df,
                                      CONCAT16(in_stack_fffffffffffff7de,
                                               CONCAT15(in_stack_fffffffffffff7dd,
                                                        in_stack_fffffffffffff7d8))),
                             (basic_string_view<char,_std::char_traits<char>_> *)
                             in_stack_fffffffffffff7d0);
          if (bVar4) {
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
            ::table_locator(&local_1a0,local_40,local_5c,local_58 + local_5c);
            goto LAB_003a09ce;
          }
          local_44 = local_44 - 1 & local_44;
        } while (local_44 != 0);
      }
      bVar4 = boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
              ::is_not_overflowed((group15<boost::unordered::detail::foa::plain_integral> *)
                                  in_stack_fffffffffffff7c0,(size_t)in_stack_fffffffffffff7b8);
      if (bVar4) {
        memset(&local_1a0,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
        ::table_locator(&local_1a0);
        goto LAB_003a09ce;
      }
      bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                        (&local_30,
                         (pfVar1->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                         .arrays.groups_size_mask);
    } while (bVar4);
    memset(&local_1a0,0,0x18);
    boost::unordered::detail::foa::
    table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
    ::table_locator(&local_1a0);
LAB_003a09ce:
    local_178 = boost::unordered::detail::foa::
                table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                ::make_iterator((locator *)0x3a09df);
    local_2a0.pc_ = local_178.pc_;
    local_2a0.p_ = local_178.p_;
    boost::unordered::detail::foa::
    table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
    ::table_iterator<false,_nullptr>(&local_280,&local_2a0);
    local_2b0 = local_280.pc_;
    local_2a8 = local_280.p_;
    local_3c8 = local_280.pc_;
    local_3c0 = local_280.p_;
    local_3d8 = boost::unordered::
                unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                       *)0x3a0ad1);
    bVar4 = boost::unordered::detail::foa::operator==
                      ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffff7c0,
                       (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                        *)in_stack_fffffffffffff7b8);
    if (bVar4) {
      local_3dc = 1;
    }
    else {
      ppVar9 = boost::unordered::detail::foa::
               table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
               ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)in_stack_fffffffffffff7c0);
      local_3e8 = (Compilation *)&ppVar9->second;
      sVar10 = slang::SmallVectorBase<const_slang::ast::Symbol_*>::size(local_380);
      while (local_3f0 = sVar10 - 1, local_3f0 != 0) {
        in_stack_fffffffffffff980 = local_3e8;
        ppSVar7 = slang::SmallVectorBase<const_slang::ast::Symbol_*>::operator[]
                            (local_380,sVar10 - 2);
        local_2e0 = &(*ppSVar7)->name;
        pCVar16 = in_stack_fffffffffffff980;
        local_2d8 = in_stack_fffffffffffff980;
        local_260 = local_2e0;
        local_258 = in_stack_fffffffffffff980;
        local_1c0 = local_2e0;
        local_1b8 = in_stack_fffffffffffff980;
        local_148 = (ConfigRule *)local_2e0;
        local_140 = in_stack_fffffffffffff980;
        in_stack_fffffffffffff990 =
             (char *)boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                     ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                               ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                 *)in_stack_fffffffffffff7c0,
                                (basic_string_view<char,_std::char_traits<char>_> *)
                                in_stack_fffffffffffff7b8);
        in_stack_fffffffffffff970 = local_148;
        local_150 = in_stack_fffffffffffff990;
        in_stack_fffffffffffff978 =
             (Scope *)boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                      *)in_stack_fffffffffffff7c0,(size_t)in_stack_fffffffffffff7b8)
        ;
        local_80 = local_150;
        in_stack_fffffffffffff988 = pCVar16;
        local_78 = in_stack_fffffffffffff978;
        local_70 = in_stack_fffffffffffff970;
        local_68 = pCVar16;
        boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                  (&local_90,(size_t)in_stack_fffffffffffff978);
        do {
          local_98 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_90);
          local_a0 = boost::unordered::detail::foa::
                     table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                     ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                               *)0x3a0cf1);
          local_a0 = local_a0 + local_98;
          local_a4 = boost::unordered::detail::foa::
                     group15<boost::unordered::detail::foa::plain_integral>::match
                               ((group15<boost::unordered::detail::foa::plain_integral> *)
                                CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                                (size_t)in_stack_fffffffffffff7c0);
          if (local_a4 != 0) {
            local_b0 = boost::unordered::detail::foa::
                       table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                       ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                   *)0x3a0d4f);
            local_b8 = local_b0 + local_98 * 0xf;
            do {
              local_bc = boost::unordered::detail::foa::unchecked_countr_zero(0);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
              ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      *)0x3a0da2);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
              ::
              key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>
                        ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                          *)0x3a0dd6);
              bVar4 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                      operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_> *
                                 )in_stack_fffffffffffff7e0,
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 CONCAT17(in_stack_fffffffffffff7df,
                                          CONCAT16(in_stack_fffffffffffff7de,
                                                   CONCAT15(in_stack_fffffffffffff7dd,
                                                            in_stack_fffffffffffff7d8))),
                                 (basic_string_view<char,_std::char_traits<char>_> *)
                                 in_stack_fffffffffffff7d0);
              if (bVar4) {
                boost::unordered::detail::foa::
                table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
                ::table_locator(&local_1d8,local_a0,local_bc,local_b8 + local_bc);
                goto LAB_003a0ef2;
              }
              local_a4 = local_a4 - 1 & local_a4;
            } while (local_a4 != 0);
          }
          bVar4 = boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                            ((group15<boost::unordered::detail::foa::plain_integral> *)
                             in_stack_fffffffffffff7c0,(size_t)in_stack_fffffffffffff7b8);
          if (bVar4) {
            memset(&local_1d8,0,0x18);
            boost::unordered::detail::foa::
            table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
            ::table_locator(&local_1d8);
            goto LAB_003a0ef2;
          }
          bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                            (&local_90,
                             (((flat_hash_map<std::string_view,_InstanceOverride> *)
                              &pCVar16->super_BumpAllocator)->table_).
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                             .arrays.groups_size_mask);
        } while (bVar4);
        memset(&local_1d8,0,0x18);
        boost::unordered::detail::foa::
        table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
        ::table_locator(&local_1d8);
LAB_003a0ef2:
        local_1b0 = boost::unordered::detail::foa::
                    table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    ::make_iterator((locator *)0x3a0f03);
        local_270.pc_ = local_1b0.pc_;
        local_270.p_ = local_1b0.p_;
        boost::unordered::detail::foa::
        table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
        ::table_iterator<false,_nullptr>(&local_250,&local_270);
        local_2d0 = local_250.pc_;
        local_2c8 = local_250.p_;
        local_400 = local_250.pc_;
        local_3f8 = local_250.p_;
        local_410 = boost::unordered::
                    unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                    ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                           *)0x3a0ff5);
        bVar4 = boost::unordered::detail::foa::operator==
                          ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffff7c0,
                           (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)in_stack_fffffffffffff7b8);
        if (bVar4) {
          local_3dc = 1;
          goto LAB_003a1af8;
        }
        ppVar9 = boost::unordered::detail::foa::
                 table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                 ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                               *)in_stack_fffffffffffff7c0);
        local_3e8 = (Compilation *)&ppVar9->second;
        sVar10 = local_3f0;
      }
      bVar4 = boost::unordered::
              unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
              ::empty((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                       *)0x3a107f);
      if (bVar4) {
        local_3dc = 1;
      }
      else {
        std::optional<slang::ast::Compilation::DefinitionLookupResult>::optional
                  ((optional<slang::ast::Compilation::DefinitionLookupResult> *)0x3a10a2);
        local_438 = slang::ast::ASTContext::getCompilation((ASTContext *)0x3a10af);
        local_440 = local_3e8;
        local_448 = local_330 + 0x68;
        local_458 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
                    begin((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x3a10fa
                         );
        local_468 = slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::
                    end((SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax> *)0x3a1139);
        SVar13.endLoc = in_stack_fffffffffffff818;
        SVar13.startLoc = in_stack_fffffffffffff820;
        SVar12.endLoc = in_stack_fffffffffffff7c0;
        SVar12.startLoc = in_stack_fffffffffffff7b8;
        while( true ) {
          bVar4 = slang::
                  operator==<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                            ((self_type *)SVar12.endLoc,
                             (iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*> *)
                             SVar12.startLoc);
          if (((bVar4 ^ 0xffU) & 1) == 0) break;
          local_470 = slang::
                      iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                      ::operator*((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                                   *)0x3a11a8);
          local_478 = (ConfigBlockSymbol *)0x0;
          if (local_470->decl == (InstanceNameSyntax *)0x0) {
            local_488 = sv((char *)SVar12.endLoc,(size_t)SVar12.startLoc);
          }
          else {
            local_488 = slang::parsing::Token::valueText(in_stack_fffffffffffff7d0);
          }
          pCVar16 = local_440;
          local_2f8 = local_440;
          local_300 = &local_488;
          local_228 = local_440;
          local_1f0 = local_440;
          local_128 = local_440;
          local_230 = local_300;
          local_1f8 = local_300;
          local_130 = local_300;
          local_138 = boost::unordered::detail::foa::
                      table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                      ::hash_for<std::basic_string_view<char,std::char_traits<char>>>
                                ((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                  *)SVar12.endLoc,
                                 (basic_string_view<char,_std::char_traits<char>_> *)SVar12.startLoc
                                );
          psVar3 = local_130;
          local_d8 = boost::unordered::detail::foa::
                     table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                     ::position_for((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                     *)SVar12.endLoc,(size_t)SVar12.startLoc);
          local_c8 = pCVar16;
          local_d0 = psVar3;
          local_e0 = local_138;
          boost::unordered::detail::foa::pow2_quadratic_prober::pow2_quadratic_prober
                    (&local_f0,local_d8);
          do {
            local_f8 = boost::unordered::detail::foa::pow2_quadratic_prober::get(&local_f0);
            local_100 = boost::unordered::detail::foa::
                        table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                        ::groups((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                  *)0x3a13b3);
            local_100 = local_100 + local_f8;
            local_104 = boost::unordered::detail::foa::
                        group15<boost::unordered::detail::foa::plain_integral>::match
                                  ((group15<boost::unordered::detail::foa::plain_integral> *)
                                   CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
                                   (size_t)SVar12.endLoc);
            if (local_104 != 0) {
              local_110 = boost::unordered::detail::foa::
                          table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                          ::elements((table_arrays<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                                      *)0x3a1411);
              local_118 = local_110 + local_f8 * 0xf;
              do {
                local_11c = boost::unordered::detail::foa::unchecked_countr_zero(0);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                ::pred((table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                        *)0x3a1464);
                boost::unordered::detail::foa::
                table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ast::ConfigBlockSymbol::InstanceOverride>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>>
                ::
                key_from<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>>
                          ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                            *)0x3a1498);
                bVar4 = std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>::
                        operator()((equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>
                                    *)in_stack_fffffffffffff7e0,
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   CONCAT17(in_stack_fffffffffffff7df,
                                            CONCAT16(in_stack_fffffffffffff7de,
                                                     CONCAT15(in_stack_fffffffffffff7dd,
                                                              in_stack_fffffffffffff7d8))),
                                   (basic_string_view<char,_std::char_traits<char>_> *)
                                   in_stack_fffffffffffff7d0);
                if (bVar4) {
                  boost::unordered::detail::foa::
                  table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
                  ::table_locator(&local_210,local_100,local_11c,local_118 + local_11c);
                  goto LAB_003a15b4;
                }
                local_104 = local_104 - 1 & local_104;
              } while (local_104 != 0);
            }
            bVar4 = boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::is_not_overflowed
                              ((group15<boost::unordered::detail::foa::plain_integral> *)
                               SVar12.endLoc,(size_t)SVar12.startLoc);
            if (bVar4) {
              memset(&local_210,0,0x18);
              boost::unordered::detail::foa::
              table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
              ::table_locator(&local_210);
              goto LAB_003a15b4;
            }
            bVar4 = boost::unordered::detail::foa::pow2_quadratic_prober::next
                              (&local_f0,
                               (((flat_hash_map<std::string_view,_InstanceOverride> *)
                                &pCVar16->super_BumpAllocator)->table_).
                               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                               .arrays.groups_size_mask);
          } while (bVar4);
          memset(&local_210,0,0x18);
          boost::unordered::detail::foa::
          table_locator<boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>
          ::table_locator(&local_210);
LAB_003a15b4:
          local_1e8 = boost::unordered::detail::foa::
                      table<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      ::make_iterator((locator *)0x3a15c5);
          local_240.pc_ = local_1e8.pc_;
          local_240.p_ = local_1e8.p_;
          context_00 = (ASTContext *)local_1e8.pc_;
          boost::unordered::detail::foa::
          table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
          ::table_iterator<false,_nullptr>(&local_220,&local_240);
          local_2f0 = (SourceLocation)local_220.pc_;
          local_2e8 = (SourceLocation)local_220.p_;
          local_498 = (SourceLocation)local_220.pc_;
          local_490 = (SourceLocation)local_220.p_;
          SVar14 = (SourceLocation)local_220.pc_;
          SVar15 = (SourceLocation)local_220.p_;
          configBlock = (SourceLocation)local_220.pc_;
          node = (SourceLocation)local_220.p_;
          local_4a8 = boost::unordered::
                      unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                      ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                             *)0x3a16b7);
          bVar5 = boost::unordered::detail::foa::operator!=
                            ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)SVar12.endLoc,
                             (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                              *)SVar12.startLoc);
          bVar4 = false;
          if (bVar5) {
            ppVar9 = boost::unordered::detail::foa::
                     table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                     ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                   *)SVar12.endLoc);
            bVar4 = (ppVar9->second).rule != (ConfigRule *)0x0;
          }
          this = SVar12.endLoc;
          if (bVar4) {
            local_4d8 = local_310;
            uStack_4d0 = uStack_308;
            in_stack_fffffffffffff828 = local_438;
            in_stack_fffffffffffff830 =
                 slang::not_null<const_slang::ast::Scope_*>::operator*
                           ((not_null<const_slang::ast::Scope_*> *)0x3a1752);
            ppVar9 = boost::unordered::detail::foa::
                     table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                     ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                                   *)this);
            in_stack_fffffffffffff810 = (ppVar9->second).rule;
            SVar12 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)in_stack_fffffffffffff810)
            ;
            local_4ec = local_314;
            lookupName._M_str = in_stack_fffffffffffff990;
            lookupName._M_len = (size_t)in_stack_fffffffffffff988;
            in_stack_fffffffffffff7c8 = local_314;
            SVar13 = SVar12;
            local_4e8 = SVar12;
            slang::ast::Compilation::getDefinition
                      (in_stack_fffffffffffff980,lookupName,in_stack_fffffffffffff978,
                       in_stack_fffffffffffff970,in_stack_fffffffffffffaa0,in_stack_fffffffffffffab0
                      );
            std::
            pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
            ::
            pair<slang::ast::Compilation::DefinitionLookupResult_&,_const_slang::syntax::HierarchicalInstanceSyntax_*&,_true>
                      (&local_510,&local_4c0,&local_470);
            slang::
            SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
            ::push_back((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                         *)SVar12.endLoc,
                        (pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                         *)SVar12.startLoc);
            local_478 = local_4c0.configRoot;
          }
          else {
            bVar4 = std::optional::operator_cast_to_bool
                              ((optional<slang::ast::Compilation::DefinitionLookupResult> *)0x3a1858
                              );
            if (!bVar4) {
              slang::not_null<const_slang::ast::Scope_*>::operator*
                        ((not_null<const_slang::ast::Scope_*> *)0x3a188a);
              SVar12 = slang::parsing::Token::range(in_stack_fffffffffffff7e0);
              name._M_str = (char *)in_stack_fffffffffffff830;
              name._M_len = (size_t)in_stack_fffffffffffff828;
              sourceRange.endLoc = SVar15;
              sourceRange.startLoc = SVar14;
              slang::ast::Compilation::getDefinition
                        ((Compilation *)SVar13.endLoc,name,(Scope *)in_stack_fffffffffffff810,
                         sourceRange,SVar13.startLoc._4_4_);
              std::optional<slang::ast::Compilation::DefinitionLookupResult>::operator=
                        ((optional<slang::ast::Compilation::DefinitionLookupResult> *)
                         in_stack_fffffffffffff7d0,
                         (DefinitionLookupResult *)
                         CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8));
            }
            in_stack_fffffffffffff7e0 = in_stack_00000008;
            pDVar11 = std::optional<slang::ast::Compilation::DefinitionLookupResult>::operator*
                                ((optional<slang::ast::Compilation::DefinitionLookupResult> *)
                                 0x3a1944);
            std::
            pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
            ::
            pair<slang::ast::Compilation::DefinitionLookupResult_&,_const_slang::syntax::HierarchicalInstanceSyntax_*&,_true>
                      ((pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                        *)&stack0xfffffffffffffa90,pDVar11,&local_470);
            slang::
            SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
            ::push_back((SmallVectorBase<std::pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                         *)SVar12.endLoc,
                        (pair<slang::ast::Compilation::DefinitionLookupResult,_const_slang::syntax::HierarchicalInstanceSyntax_*>
                         *)SVar12.startLoc);
            pDVar11 = std::optional<slang::ast::Compilation::DefinitionLookupResult>::operator->
                                ((optional<slang::ast::Compilation::DefinitionLookupResult> *)
                                 0x3a197f);
            local_478 = pDVar11->configRoot;
          }
          in_stack_fffffffffffff7df = false;
          if (local_478 != (ConfigBlockSymbol *)0x0) {
            boost::unordered::
            unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
            ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   *)0x3a19a9);
            in_stack_fffffffffffff7de =
                 boost::unordered::detail::foa::operator!=
                           ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)SVar12.endLoc,
                            (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                             *)SVar12.startLoc);
            in_stack_fffffffffffff7df = in_stack_fffffffffffff7de;
          }
          if ((bool)in_stack_fffffffffffff7df != false) {
            boost::unordered::detail::foa::
            table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
            ::operator->((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                          *)SVar12.endLoc);
            boost::unordered::
            unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
            ::begin((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                     *)0x3a1a11);
            boost::unordered::
            unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
            ::end((unordered_flat_map<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>_>_>
                   *)0x3a1a2e);
            while( true ) {
              in_stack_fffffffffffff7dd =
                   boost::unordered::detail::foa::operator!=
                             ((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                               *)SVar12.endLoc,
                              (table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                               *)SVar12.startLoc);
              if (!(bool)in_stack_fffffffffffff7dd) break;
              boost::unordered::detail::foa::
              table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
              ::operator*((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                           *)0x3a1a70);
              std::
              get<0ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
                        ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                          *)0x3a1a85);
              std::
              get<1ul,std::basic_string_view<char,std::char_traits<char>>const,slang::ast::ConfigBlockSymbol::InstanceOverride>
                        ((pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>
                          *)0x3a1a9a);
              checkForInvalidNestedConfigNodes
                        (context_00,(InstanceOverride *)node,(ConfigBlockSymbol *)configBlock);
              boost::unordered::detail::foa::
              table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
              ::operator++((table_iterator<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::ConfigBlockSymbol::InstanceOverride>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_true>
                            *)SVar12.endLoc);
            }
          }
          slang::
          iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
          ::
          operator++<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>_>
                    ((iterator_facade<slang::syntax::SeparatedSyntaxList<slang::syntax::HierarchicalInstanceSyntax>::iterator_base<const_slang::syntax::HierarchicalInstanceSyntax_*>,_false>
                      *)SVar12.endLoc);
        }
        local_3dc = 0;
      }
    }
LAB_003a1af8:
    slang::SmallVector<const_slang::ast::Symbol_*,_5UL>::~SmallVector
              ((SmallVector<const_slang::ast::Symbol_*,_5UL> *)0x3a1b05);
  }
  return;
}

Assistant:

void resolveInstanceOverrides(const ResolvedConfig& resolvedConfig, const ASTContext& context,
                              const TSyntax& syntax, std::string_view defName, DiagCode missingCode,
                              ResolvedInstanceRules& results) {
    auto& instOverrides = resolvedConfig.useConfig.getInstanceOverrides();
    if (instOverrides.empty())
        return;

    // Start by walking up our parent stack and recording each symbol
    // so we can walk back downward in the correct order when traversing
    // the instanceOverrides tree.
    const Scope* scope = context.scope;
    SmallVector<const Symbol*> parentStack;
    while (true) {
        auto sym = &scope->asSymbol();
        if (sym->kind == SymbolKind::InstanceBody) {
            sym = sym->as<InstanceBodySymbol>().parentInstance;
            SLANG_ASSERT(sym);
        }

        parentStack.push_back(sym);

        scope = sym->getParentScope();
        if (!scope || &resolvedConfig.rootInstance == sym)
            break;
    }

    // Start going down the instance path tree, from the root.
    auto rootSym = parentStack.back();
    auto rootName = rootSym->kind == SymbolKind::Instance
                        ? rootSym->as<InstanceSymbol>().getDefinition().name
                        : rootSym->name;

    auto rootIt = instOverrides.find(rootName);
    if (rootIt == instOverrides.end())
        return;

    // Then through child nodes.
    auto overrideNode = &rootIt->second;
    for (size_t i = parentStack.size() - 1; i > 0; i--) {
        auto childIt = overrideNode->childNodes.find(parentStack[i - 1]->name);
        if (childIt == overrideNode->childNodes.end())
            return;

        overrideNode = &childIt->second;
    }

    // If we reached this point and have child nodes then there's more work
    // to figure out each individual instance.
    if (overrideNode->childNodes.empty())
        return;

    // We need to handle each instance separately, as the config
    // rules allow the entire definition and parameter values
    // to be overridden on a per-instance basis.
    std::optional<Compilation::DefinitionLookupResult> explicitDef;
    auto& comp = context.getCompilation();
    auto& overrideMap = overrideNode->childNodes;
    for (auto instSyntax : syntax.instances) {
        const ConfigBlockSymbol* nestedConfig = nullptr;
        auto instName = instSyntax->decl ? instSyntax->decl->name.valueText() : ""sv;

        auto ruleIt = overrideMap.find(instName);
        if (ruleIt != overrideMap.end() && ruleIt->second.rule) {
            // We have an override rule, so use it to lookup the def.
            auto defResult = comp.getDefinition(defName, *context.scope, *ruleIt->second.rule,
                                                instSyntax->sourceRange(), missingCode);
            results.push_back({defResult, instSyntax});
            nestedConfig = defResult.configRoot;
        }
        else {
            // No specific config rule, so use the default lookup behavior.
            if (!explicitDef) {
                explicitDef = comp.getDefinition(defName, *context.scope, syntax.type.range(),
                                                 missingCode);
            }
            results.push_back({*explicitDef, instSyntax});
            nestedConfig = explicitDef->configRoot;
        }

        // If we found a new nested config block that applies hierarchically
        // to our instance and children, any other rules that would apply
        // further down the tree from the original config are invalid.
        if (nestedConfig && ruleIt != overrideMap.end()) {
            for (auto& [_, child] : ruleIt->second.childNodes)
                checkForInvalidNestedConfigNodes(context, child, *nestedConfig);
        }
    }
}